

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O2

bool __thiscall GraphPropagator::propagate(GraphPropagator *this)

{
  BoolView *pBVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  int i;
  long lVar5;
  
  lVar4 = 0;
  lVar5 = 0;
  while( true ) {
    if ((int)(this->vs).sz <= lVar5) {
      lVar4 = 0;
      lVar5 = 0;
      while( true ) {
        lVar3 = (long)(int)(this->es).sz;
        if (lVar3 <= lVar5) {
          return lVar3 <= lVar5;
        }
        pBVar1 = (this->es).data;
        if (((sat.assigns.data[*(uint *)((long)&pBVar1->v + lVar4)] != '\0') &&
            (bVar2 = BoolView::isTrue((BoolView *)
                                      ((long)&(pBVar1->super_Var).super_Branching._vptr_Branching +
                                      lVar4)), bVar2)) &&
           (bVar2 = coherence_innodes(this,(int)lVar5), !bVar2)) break;
        lVar5 = lVar5 + 1;
        lVar4 = lVar4 + 0x10;
      }
      return lVar3 <= lVar5;
    }
    pBVar1 = (this->vs).data;
    if (((sat.assigns.data[*(uint *)((long)&pBVar1->v + lVar4)] != '\0') &&
        (bVar2 = BoolView::isFalse((BoolView *)
                                   ((long)&(pBVar1->super_Var).super_Branching._vptr_Branching +
                                   lVar4)), bVar2)) &&
       (bVar2 = coherence_outedges(this,(int)lVar5), !bVar2)) break;
    lVar5 = lVar5 + 1;
    lVar4 = lVar4 + 0x10;
  }
  return false;
}

Assistant:

bool GraphPropagator::propagate() {
	for (int i = 0; i < nbNodes(); i++) {
		if (getNodeVar(i).isFixed() && getNodeVar(i).isFalse()) {
			if (!coherence_outedges(i)) {
				return false;
			}
		}
	}
	for (int i = 0; i < nbEdges(); i++) {
		if (getEdgeVar(i).isFixed() && getEdgeVar(i).isTrue()) {
			if (!coherence_innodes(i)) {
				return false;
			}
		}
	}
	return true;
}